

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int open_set_container_id(OPEN_HANDLE open,char *container_id_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  OPEN_INSTANCE *open_instance;
  
  if (open == (OPEN_HANDLE)0x0) {
    iVar2 = 0x488;
  }
  else {
    item_value = amqpvalue_create_string(container_id_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x490;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(open->composite_value,0,item_value);
      iVar2 = 0x496;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int open_set_container_id(OPEN_HANDLE open, const char* container_id_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        AMQP_VALUE container_id_amqp_value = amqpvalue_create_string(container_id_value);
        if (container_id_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(open_instance->composite_value, 0, container_id_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(container_id_amqp_value);
        }
    }

    return result;
}